

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseCompiler::onDetach(BaseCompiler *this,CodeHolder *code)

{
  Error EVar1;
  BaseBuilder *in_RSI;
  CodeHolder *in_RDI;
  ResetPolicy unaff_retaddr;
  Zone *in_stack_00000008;
  
  *(undefined8 *)&in_RDI[1].field_0x60 = 0;
  *(undefined8 *)&in_RDI[1].field_0xb0 = 0;
  *(undefined8 *)&in_RDI[1].field_0xb8 = 0;
  *(undefined8 *)&in_RDI[1].field_0x90 = 0;
  *(undefined4 *)&in_RDI[1].field_0x98 = 0;
  *(undefined4 *)&in_RDI[1].field_0x9c = 0;
  Zone::reset(in_stack_00000008,unaff_retaddr);
  EVar1 = BaseBuilder::onDetach(in_RSI,in_RDI);
  return EVar1;
}

Assistant:

Error BaseCompiler::onDetach(CodeHolder* code) noexcept {
  _func = nullptr;
  _constPools[uint32_t(ConstPoolScope::kLocal)] = nullptr;
  _constPools[uint32_t(ConstPoolScope::kGlobal)] = nullptr;

  _vRegArray.reset();
  _vRegZone.reset();

  return Base::onDetach(code);
}